

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
          (basic_json_encode_options<char> *this,void **vtt)

{
  long *in_RSI;
  long *in_RDI;
  
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18)) = in_RSI[1];
  std::__cxx11::string::~string((string *)(in_RDI + 4));
  return;
}

Assistant:

~basic_json_encode_options() = default;